

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmRST.cxx
# Opt level: O3

void __thiscall cmRST::cmRST(cmRST *this,ostream *os,string *docroot)

{
  _Rb_tree_header *p_Var1;
  pointer pcVar2;
  char *pcVar3;
  char *__s;
  mapped_type *pmVar4;
  key_type local_50;
  
  this->OS = os;
  (this->DocRoot)._M_dataplus._M_p = (pointer)&(this->DocRoot).field_2;
  pcVar2 = (docroot->_M_dataplus)._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&this->DocRoot,pcVar2,pcVar2 + docroot->_M_string_length);
  this->IncludeDepth = 0;
  this->OutputLinePending = false;
  this->LastLineEndedInColonColon = false;
  this->Markup = MarkupNone;
  this->Directive = DirectiveNone;
  (this->CMakeDirective).program = (char *)0x0;
  cmsys::RegularExpression::compile
            (&this->CMakeDirective,"^.. (cmake:)?(command|variable)::[ \t]+([^ \t\n]+)$");
  (this->CMakeModuleDirective).program = (char *)0x0;
  cmsys::RegularExpression::compile
            (&this->CMakeModuleDirective,"^.. cmake-module::[ \t]+([^ \t\n]+)$");
  (this->ParsedLiteralDirective).program = (char *)0x0;
  cmsys::RegularExpression::compile(&this->ParsedLiteralDirective,"^.. parsed-literal::[ \t]*(.*)$")
  ;
  (this->CodeBlockDirective).program = (char *)0x0;
  cmsys::RegularExpression::compile(&this->CodeBlockDirective,"^.. code-block::[ \t]*(.*)$");
  (this->ReplaceDirective).program = (char *)0x0;
  cmsys::RegularExpression::compile
            (&this->ReplaceDirective,"^.. (\\|[^|]+\\|) replace::[ \t]*(.*)$");
  (this->IncludeDirective).program = (char *)0x0;
  cmsys::RegularExpression::compile(&this->IncludeDirective,"^.. include::[ \t]+([^ \t\n]+)$");
  (this->TocTreeDirective).program = (char *)0x0;
  cmsys::RegularExpression::compile(&this->TocTreeDirective,"^.. toctree::[ \t]*(.*)$");
  (this->ProductionListDirective).program = (char *)0x0;
  cmsys::RegularExpression::compile
            (&this->ProductionListDirective,"^.. productionlist::[ \t]*(.*)$");
  (this->NoteDirective).program = (char *)0x0;
  cmsys::RegularExpression::compile(&this->NoteDirective,"^.. note::[ \t]*(.*)$");
  (this->ModuleRST).program = (char *)0x0;
  cmsys::RegularExpression::compile(&this->ModuleRST,"^#\\[(=*)\\[\\.rst:$");
  (this->CMakeRole).program = (char *)0x0;
  cmsys::RegularExpression::compile
            (&this->CMakeRole,
             "(:cmake)?:(command|generator|variable|module|policy|prop_cache|prop_dir|prop_gbl|prop_inst|prop_sf|prop_test|prop_tgt|manual):`(<*([^`<]|[^` \t]<)*)([ \t]+<[^`]*>)?`"
            );
  (this->Substitution).program = (char *)0x0;
  cmsys::RegularExpression::compile
            (&this->Substitution,
             "(^|[^A-Za-z0-9_])((\\|[^| \t\r\n]([^|\r\n]*[^| \t\r\n])?\\|)(__|_|))([^A-Za-z0-9_]|$)"
            );
  (this->MarkupLines).
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->MarkupLines).
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->MarkupLines).
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->DocDir)._M_dataplus._M_p = (pointer)&(this->DocDir).field_2;
  (this->DocDir)._M_string_length = 0;
  (this->DocDir).field_2._M_local_buf[0] = '\0';
  p_Var1 = &(this->Replace)._M_t._M_impl.super__Rb_tree_header;
  (this->Replace)._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (this->Replace)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  (this->Replace)._M_t._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var1->_M_header;
  (this->Replace)._M_t._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var1->_M_header;
  (this->Replace)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  p_Var1 = &(this->Replaced)._M_t._M_impl.super__Rb_tree_header;
  (this->Replaced)._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (this->Replaced)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  (this->Replaced)._M_t._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var1->_M_header;
  (this->Replaced)._M_t._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var1->_M_header;
  (this->Replaced)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  (this->ReplaceName)._M_dataplus._M_p = (pointer)&(this->ReplaceName).field_2;
  (this->ReplaceName)._M_string_length = 0;
  (this->ReplaceName).field_2._M_local_buf[0] = '\0';
  __s = cmVersion::GetCMakeVersion();
  local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_50,"|release|","");
  pmVar4 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ::operator[](&this->Replace,&local_50);
  pcVar3 = (char *)pmVar4->_M_string_length;
  strlen(__s);
  std::__cxx11::string::_M_replace((ulong)pmVar4,0,pcVar3,(ulong)__s);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_50._M_dataplus._M_p != &local_50.field_2) {
    operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
  }
  return;
}

Assistant:

cmRST::cmRST(std::ostream& os, std::string const& docroot):
  OS(os),
  DocRoot(docroot),
  IncludeDepth(0),
  OutputLinePending(false),
  LastLineEndedInColonColon(false),
  Markup(MarkupNone),
  Directive(DirectiveNone),
  CMakeDirective("^.. (cmake:)?("
                 "command|variable"
                 ")::[ \t]+([^ \t\n]+)$"),
  CMakeModuleDirective("^.. cmake-module::[ \t]+([^ \t\n]+)$"),
  ParsedLiteralDirective("^.. parsed-literal::[ \t]*(.*)$"),
  CodeBlockDirective("^.. code-block::[ \t]*(.*)$"),
  ReplaceDirective("^.. (\\|[^|]+\\|) replace::[ \t]*(.*)$"),
  IncludeDirective("^.. include::[ \t]+([^ \t\n]+)$"),
  TocTreeDirective("^.. toctree::[ \t]*(.*)$"),
  ProductionListDirective("^.. productionlist::[ \t]*(.*)$"),
  NoteDirective("^.. note::[ \t]*(.*)$"),
  ModuleRST("^#\\[(=*)\\[\\.rst:$"),
  CMakeRole("(:cmake)?:("
            "command|generator|variable|module|policy|"
            "prop_cache|prop_dir|prop_gbl|prop_inst|prop_sf|"
            "prop_test|prop_tgt|"
            "manual"
            "):`(<*([^`<]|[^` \t]<)*)([ \t]+<[^`]*>)?`"),
  Substitution("(^|[^A-Za-z0-9_])"
               "((\\|[^| \t\r\n]([^|\r\n]*[^| \t\r\n])?\\|)(__|_|))"
               "([^A-Za-z0-9_]|$)")
{
  this->Replace["|release|"] = cmVersion::GetCMakeVersion();
}